

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLLADDERBOTTOM_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000108;
  double *in_stack_00000110;
  double *in_stack_00000118;
  double *in_stack_00000120;
  int in_stack_0000012c;
  int in_stack_00000130;
  int *in_stack_00000140;
  int *in_stack_00000148;
  int *in_stack_00000150;
  
  TVar1 = TA_CDLLADDERBOTTOM(in_stack_00000130,in_stack_0000012c,in_stack_00000120,in_stack_00000118
                             ,in_stack_00000110,in_stack_00000108,in_stack_00000140,
                             in_stack_00000148,in_stack_00000150);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLLADDERBOTTOM_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLLADDERBOTTOM(
/* Generated */                         startIdx,
/* Generated */                         endIdx,
/* Generated */                         params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                         params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                         params->in[0].data.inPrice.low, /* inLow */
/* Generated */                         params->in[0].data.inPrice.close, /* inClose */
/* Generated */                         outBegIdx, 
/* Generated */                         outNBElement, 
/* Generated */                         params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }